

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

TxfmFunc inv_txfm_type_to_func(TXFM_TYPE txfm_type)

{
  TXFM_TYPE txfm_type_local;
  TxfmFunc local_8;
  
  switch(txfm_type) {
  case '\0':
    local_8 = av1_idct4;
    break;
  case '\x01':
    local_8 = av1_idct8;
    break;
  case '\x02':
    local_8 = av1_idct16;
    break;
  case '\x03':
    local_8 = av1_idct32;
    break;
  case '\x04':
    local_8 = av1_idct64;
    break;
  case '\x05':
    local_8 = av1_iadst4;
    break;
  case '\x06':
    local_8 = av1_iadst8;
    break;
  case '\a':
    local_8 = av1_iadst16;
    break;
  case '\b':
    local_8 = av1_iidentity4_c;
    break;
  case '\t':
    local_8 = av1_iidentity8_c;
    break;
  case '\n':
    local_8 = av1_iidentity16_c;
    break;
  case '\v':
    local_8 = av1_iidentity32_c;
    break;
  default:
    local_8 = (TxfmFunc)0x0;
  }
  return local_8;
}

Assistant:

static inline TxfmFunc inv_txfm_type_to_func(TXFM_TYPE txfm_type) {
  switch (txfm_type) {
    case TXFM_TYPE_DCT4: return av1_idct4;
    case TXFM_TYPE_DCT8: return av1_idct8;
    case TXFM_TYPE_DCT16: return av1_idct16;
    case TXFM_TYPE_DCT32: return av1_idct32;
    case TXFM_TYPE_DCT64: return av1_idct64;
    case TXFM_TYPE_ADST4: return av1_iadst4;
    case TXFM_TYPE_ADST8: return av1_iadst8;
    case TXFM_TYPE_ADST16: return av1_iadst16;
    case TXFM_TYPE_IDENTITY4: return av1_iidentity4_c;
    case TXFM_TYPE_IDENTITY8: return av1_iidentity8_c;
    case TXFM_TYPE_IDENTITY16: return av1_iidentity16_c;
    case TXFM_TYPE_IDENTITY32: return av1_iidentity32_c;
    default: assert(0); return NULL;
  }
}